

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.cpp
# Opt level: O3

size_t duckdb_zstd::FSE_writeNCount_generic
                 (void *header,size_t headerBufferSize,short *normalizedCounter,uint maxSymbolValue,
                 uint tableLog,uint writeIsSafe)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined2 *puVar7;
  uint uVar8;
  uint uVar9;
  undefined2 *puVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  bool bVar19;
  
  uVar18 = maxSymbolValue + 1;
  if (uVar18 == 0) {
    return 0xffffffffffffffff;
  }
  uVar14 = tableLog - 5;
  iVar17 = 1 << ((byte)tableLog & 0x1f);
  puVar10 = (undefined2 *)((long)header + (headerBufferSize - 2));
  iVar6 = 4;
  bVar19 = false;
  uVar11 = 0;
  puVar7 = (undefined2 *)header;
  iVar12 = tableLog + 1;
  uVar9 = iVar17 + 1;
  do {
    if (bVar19) {
      uVar13 = uVar11;
      if ((uint)uVar11 < uVar18) {
        while (normalizedCounter[uVar13] == 0) {
          uVar13 = uVar13 + 1;
          if (uVar18 == uVar13) goto LAB_01d5f3c6;
        }
      }
      uVar8 = (uint)uVar13;
      if (uVar8 == uVar18) {
LAB_01d5f3c6:
        iVar12 = iVar6 + 0xe;
        if (-1 < iVar6 + 7) {
          iVar12 = iVar6 + 7;
        }
        if (uVar9 != 1) {
          return 0xffffffffffffffff;
        }
        if ((writeIsSafe == 0) && (puVar10 < puVar7)) {
          return 0xffffffffffffffba;
        }
        *puVar7 = (short)uVar14;
        return (long)puVar7 + ((long)(iVar12 >> 3) - (long)header);
      }
      if ((uint)uVar11 + 0x18 <= uVar8) {
        uVar16 = uVar11;
        do {
          if ((writeIsSafe == 0) && (puVar10 < puVar7)) {
            return 0xffffffffffffffba;
          }
          uVar14 = uVar14 + (0xffff << ((byte)iVar6 & 0x1f));
          *puVar7 = (short)uVar14;
          puVar7 = puVar7 + 1;
          uVar14 = uVar14 >> 0x10;
          iVar2 = (int)uVar16;
          uVar4 = iVar2 + 0x18;
          uVar11 = (ulong)uVar4;
          uVar16 = (ulong)uVar4;
        } while (iVar2 + 0x30U <= uVar8);
      }
      uVar4 = (uint)uVar11;
      uVar3 = uVar4 + 3;
      while (uVar3 <= uVar8) {
        uVar14 = uVar14 + (3 << ((byte)iVar6 & 0x1f));
        iVar6 = iVar6 + 2;
        iVar2 = (int)uVar11;
        uVar4 = iVar2 + 3;
        uVar11 = (ulong)uVar4;
        uVar3 = iVar2 + 6;
      }
      uVar14 = (uVar8 - uVar4 << ((byte)iVar6 & 0x1f)) + uVar14;
      uVar11 = uVar13;
      if (iVar6 < 0xf) {
        iVar6 = iVar6 + 2;
      }
      else {
        if ((writeIsSafe == 0) && (puVar10 < puVar7)) {
          return 0xffffffffffffffba;
        }
        *puVar7 = (short)uVar14;
        puVar7 = puVar7 + 1;
        uVar14 = uVar14 >> 0x10;
        iVar6 = iVar6 + -0xe;
      }
    }
    iVar5 = (int)normalizedCounter[uVar11 & 0xffffffff];
    iVar2 = -iVar5;
    if (0 < iVar5) {
      iVar2 = iVar5;
    }
    iVar1 = ~uVar9 + iVar17 * 2;
    iVar15 = iVar1;
    if (iVar5 + 1 < iVar17) {
      iVar15 = 0;
    }
    iVar15 = iVar15 + iVar5 + 1;
    bVar19 = iVar15 == 1;
    uVar8 = uVar9 - iVar2;
    iVar5 = iVar12;
    if (uVar8 == 0 || (int)uVar9 < iVar2) {
      return 0xffffffffffffffff;
    }
    for (; (int)uVar8 < iVar17; iVar17 = iVar17 >> 1) {
      iVar5 = iVar5 + -1;
    }
    uVar14 = uVar14 + (iVar15 << ((byte)iVar6 & 0x1f));
    iVar6 = (iVar6 + iVar12) - (uint)(iVar15 < iVar1);
    if (0x10 < iVar6) {
      if (writeIsSafe == 0 && puVar10 < puVar7) {
        return 0xffffffffffffffba;
      }
      *puVar7 = (short)uVar14;
      puVar7 = puVar7 + 1;
      uVar14 = uVar14 >> 0x10;
      iVar6 = iVar6 + -0x10;
    }
    uVar4 = (int)uVar11 + 1;
    uVar9 = uVar8;
    if ((uVar18 <= uVar4) || (uVar11 = (ulong)uVar4, iVar12 = iVar5, uVar8 == 1)) goto LAB_01d5f3c6;
  } while( true );
}

Assistant:

static size_t
FSE_writeNCount_generic (void* header, size_t headerBufferSize,
                   const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                         unsigned writeIsSafe)
{
    BYTE* const ostart = (BYTE*) header;
    BYTE* out = ostart;
    BYTE* const oend = ostart + headerBufferSize;
    int nbBits;
    const int tableSize = 1 << tableLog;
    int remaining;
    int threshold;
    U32 bitStream = 0;
    int bitCount = 0;
    unsigned symbol = 0;
    unsigned const alphabetSize = maxSymbolValue + 1;
    int previousIs0 = 0;

    /* Table Size */
    bitStream += (tableLog-FSE_MIN_TABLELOG) << bitCount;
    bitCount  += 4;

    /* Init */
    remaining = tableSize+1;   /* +1 for extra accuracy */
    threshold = tableSize;
    nbBits = (int)tableLog+1;

    while ((symbol < alphabetSize) && (remaining>1)) {  /* stops at 1 */
        if (previousIs0) {
            unsigned start = symbol;
            while ((symbol < alphabetSize) && !normalizedCounter[symbol]) symbol++;
            if (symbol == alphabetSize) break;   /* incorrect distribution */
            while (symbol >= start+24) {
                start+=24;
                bitStream += 0xFFFFU << bitCount;
                if ((!writeIsSafe) && (out > oend-2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE) bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out+=2;
                bitStream>>=16;
            }
            while (symbol >= start+3) {
                start+=3;
                bitStream += 3U << bitCount;
                bitCount += 2;
            }
            bitStream += (symbol-start) << bitCount;
            bitCount += 2;
            if (bitCount>16) {
                if ((!writeIsSafe) && (out > oend - 2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE)bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out += 2;
                bitStream >>= 16;
                bitCount -= 16;
        }   }
        {   int count = normalizedCounter[symbol++];
            int const max = (2*threshold-1) - remaining;
            remaining -= count < 0 ? -count : count;
            count++;   /* +1 for extra accuracy */
            if (count>=threshold)
                count += max;   /* [0..max[ [max..threshold[ (...) [threshold+max 2*threshold[ */
            bitStream += (U32)count << bitCount;
            bitCount  += nbBits;
            bitCount  -= (count<max);
            previousIs0  = (count==1);
            if (remaining<1) return ERROR(GENERIC);
            while (remaining<threshold) { nbBits--; threshold>>=1; }
        }
        if (bitCount>16) {
            if ((!writeIsSafe) && (out > oend - 2))
                return ERROR(dstSize_tooSmall);   /* Buffer overflow */
            out[0] = (BYTE)bitStream;
            out[1] = (BYTE)(bitStream>>8);
            out += 2;
            bitStream >>= 16;
            bitCount -= 16;
    }   }

    if (remaining != 1)
        return ERROR(GENERIC);  /* incorrect normalized distribution */
    assert(symbol <= alphabetSize);

    /* flush remaining bitStream */
    if ((!writeIsSafe) && (out > oend - 2))
        return ERROR(dstSize_tooSmall);   /* Buffer overflow */
    out[0] = (BYTE)bitStream;
    out[1] = (BYTE)(bitStream>>8);
    out+= (bitCount+7) /8;

    assert(out >= ostart);
    return (size_t)(out-ostart);
}